

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void ActionUnserialize::
     SerReadWriteMany<DataStream,std::array<unsigned_char,4ul>&,char(&)[12],unsigned_int&,unsigned_char(&)[4]>
               (DataStream *s,array<unsigned_char,_4UL> *args,char (*args_1) [12],uint *args_2,
               uchar (*args_3) [4])

{
  long lVar1;
  char (*in_RCX) [12];
  array<unsigned_char,_4UL> *in_RDX;
  DataStream *in_RSI;
  uint *in_R8;
  long in_FS_OFFSET;
  uchar (*in_stack_ffffffffffffffc8) [4];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UnserializeMany<DataStream,std::array<unsigned_char,4ul>&,char(&)[12],unsigned_int&,unsigned_char(&)[4]>
            (in_RSI,in_RDX,in_RCX,in_R8,in_stack_ffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void SerReadWriteMany(Stream& s, Args&&... args)
    {
        ::UnserializeMany(s, args...);
    }